

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O1

void __thiscall
MemoryLeakDetector::deallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,void *memory,char *file,
          size_t line,bool allocatNodesSeperately)

{
  MemoryLeakFailure *reporter;
  undefined8 uVar1;
  bool bVar2;
  MemoryLeakDetectorNode *node;
  TestMemoryAllocator *allocAllocator;
  
  if (memory != (void *)0x0) {
    node = MemoryLeakDetectorTable::removeNode(&this->memoryTable_,(char *)memory);
    if (node == (MemoryLeakDetectorNode *)0x0) {
      reporter = this->reporter_;
      allocAllocator = NullUnknownAllocator::defaultAllocator();
      MemoryLeakOutputStringBuffer::reportFailure
                (&this->outputBuffer_,"Deallocating non-allocated memory\n","<unknown>",0,0,
                 allocAllocator,file,line,allocator,reporter);
    }
    else {
      bVar2 = TestMemoryAllocator::hasBeenDestroyed(allocator);
      if (!bVar2) {
        uVar1 = *(undefined8 *)node;
        checkForCorruption(this,node,file,line,allocator,allocatNodesSeperately);
        (*allocator->_vptr_TestMemoryAllocator[3])(allocator,memory,uVar1,file,line);
        return;
      }
    }
  }
  return;
}

Assistant:

void MemoryLeakDetector::deallocMemory(TestMemoryAllocator* allocator, void* memory, const char* file, size_t line, bool allocatNodesSeperately)
{
    if (memory == NULLPTR) return;

    MemoryLeakDetectorNode* node = memoryTable_.removeNode((char*) memory);
    if (node == NULLPTR) {
        outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
        return;
    }
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (!allocator->hasBeenDestroyed()) {
        size_t size = node->size_;
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
        allocator->free_memory((char*) memory, size, file, line);
    }
}